

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O3

void * csp_zmqhub_task(void *param)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  csp_packet_t *packet;
  void *__src;
  zmq_driver_t *drv;
  uint uVar6;
  bool bVar7;
  zmq_msg_t msg;
  undefined1 local_70 [64];
  
  bVar7 = csp_conf.version == '\x02';
  uVar6 = (uint)bVar7 * 2 + 4;
  do {
    while( true ) {
      while( true ) {
        zmq_msg_init_size(local_70,(uint)bVar7 * 2 + 0x104);
        iVar2 = zmq_msg_recv(local_70,*(undefined8 *)((long)param + 0x18),0);
        if (-1 < iVar2) break;
        uVar1 = *(undefined8 *)((long)param + 0x38);
        uVar4 = zmq_errno();
        uVar5 = zmq_strerror(uVar4);
        csp_print_func("ZMQ RX err %s: %s\n",uVar1,uVar5);
      }
      uVar3 = zmq_msg_size();
      if (uVar6 <= uVar3) break;
      csp_print_func("ZMQ RX %s: Too short datalen: %u - expected min %u bytes\n",
                     *(undefined8 *)((long)param + 0x38),(ulong)uVar3,(ulong)uVar6);
LAB_0010e8f2:
      zmq_msg_close(local_70);
    }
    packet = csp_buffer_get(0);
    if (packet == (csp_packet_t *)0x0) {
      csp_print_func("RX %s: Failed to get csp_buffer(%u)\n",*(undefined8 *)((long)param + 0x38),
                     (ulong)uVar3);
      goto LAB_0010e8f2;
    }
    __src = (void *)zmq_msg_data(local_70);
    csp_id_setup_rx(packet);
    memcpy((packet->field_0).field_1.frame_begin,__src,(ulong)uVar3);
    (packet->field_0).field_1.frame_length = (uint16_t)uVar3;
    iVar2 = csp_id_strip(packet);
    if (iVar2 == 0) {
      csp_qfifo_write(packet,(csp_iface_t *)((long)param + 0x30),(void *)0x0);
    }
    else {
      *(int *)((long)param + 0x68) = *(int *)((long)param + 0x68) + 1;
      csp_buffer_free(packet);
    }
    zmq_msg_close(local_70);
  } while( true );
}

Assistant:

void * csp_zmqhub_task(void * param) {

	zmq_driver_t * drv = param;
	csp_packet_t * packet;
	const uint32_t HEADER_SIZE = (csp_conf.version == 2) ? 6 : 4;

	while (1) {
		int ret;
		(void)ret; /* Silence unused variable warning (promoted to an error if -Werr) issued when building with NDEBUG (release with asserts turned off) */
		zmq_msg_t msg;

		ret = zmq_msg_init_size(&msg, sizeof(packet->data) + HEADER_SIZE);
		assert(ret == 0);

		// Receive data
		if (zmq_msg_recv(&msg, drv->subscriber, 0) < 0) {
			csp_print("ZMQ RX err %s: %s\n", drv->iface.name, zmq_strerror(zmq_errno()));
			continue;
		}

		unsigned int datalen = zmq_msg_size(&msg);
		if (datalen < HEADER_SIZE) {
			csp_print("ZMQ RX %s: Too short datalen: %u - expected min %u bytes\n", drv->iface.name, datalen, HEADER_SIZE);
			zmq_msg_close(&msg);
			continue;
		}

		// Create new csp packet
		packet = csp_buffer_get(0);
		if (packet == NULL) {
			csp_print("RX %s: Failed to get csp_buffer(%u)\n", drv->iface.name, datalen);
			zmq_msg_close(&msg);
			continue;
		}

		// Copy the data from zmq to csp
		const uint8_t * rx_data = zmq_msg_data(&msg);

		csp_id_setup_rx(packet);

		memcpy(packet->frame_begin, rx_data, datalen);
		packet->frame_length = datalen;

		/* Parse the frame and strip the ID field */
		if (csp_id_strip(packet) != 0) {
			drv->iface.rx_error++;
			csp_buffer_free(packet);
		    zmq_msg_close(&msg);
			continue;
		}

		// Route packet
		csp_qfifo_write(packet, &drv->iface, NULL);

		zmq_msg_close(&msg);
	}

	return NULL;
}